

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O1

void __thiscall luna::SemanticAnalysisVisitor::DeleteCurrentBlock(SemanticAnalysisVisitor *this)

{
  LexicalFunction *pLVar1;
  LexicalBlock *pLVar2;
  
  pLVar1 = this->current_function_;
  if ((pLVar1 != (LexicalFunction *)0x0) &&
     (pLVar2 = pLVar1->current_block_, pLVar2 != (LexicalBlock *)0x0)) {
    pLVar1->current_block_ = pLVar2->parent_;
    std::
    _Hashtable<const_luna::String_*,_const_luna::String_*,_std::allocator<const_luna::String_*>,_std::__detail::_Identity,_std::equal_to<const_luna::String_*>,_std::hash<const_luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&(pLVar2->names_)._M_h);
    operator_delete(pLVar2);
    return;
  }
  __assert_fail("current_function_ && current_function_->current_block_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                ,0xbf,"void luna::SemanticAnalysisVisitor::DeleteCurrentBlock()");
}

Assistant:

void DeleteCurrentBlock()
        {
            assert(current_function_ && current_function_->current_block_);
            auto block = current_function_->current_block_;
            current_function_->current_block_ = block->parent_;
            delete block;
        }